

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

HighsStatus __thiscall
HighsIis::compute(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis)

{
  pointer *ppHVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar2;
  int iVar3;
  iterator iVar4;
  pointer piVar5;
  _Alloc_hider _Var6;
  HighsInt HVar7;
  HighsStatus HVar8;
  int iVar9;
  HighsLp *pHVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  pointer pdVar12;
  undefined8 uVar13;
  uint bound_status;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  char *pcVar14;
  pointer extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  pointer __buf_00;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *pvVar15;
  pointer __buf_01;
  pointer extraout_RDX_07;
  pointer extraout_RDX_08;
  pointer piVar16;
  pointer extraout_RDX_09;
  pointer extraout_RDX_10;
  ulong uVar17;
  byte bVar18;
  HighsInt HVar19;
  int iVar20;
  ulong __new_size;
  uint uVar21;
  char *pcVar22;
  HighsIis *this_01;
  long lVar23;
  vector<int,_std::allocator<int>_> *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  string type;
  double check_lower;
  HighsInt check_num_nz;
  HighsInt check_num_ix;
  double check_upper;
  vector<double,_std::allocator<double>_> cost;
  double check_cost;
  Highs highs;
  double local_5660;
  double local_5658;
  string local_5650;
  HighsIis *local_5630;
  vector<int,_std::allocator<int>_> *local_5628;
  HighsStatus local_561c;
  double local_5618;
  string local_5610;
  uint local_55f0;
  uint local_55ec;
  uint local_55e8;
  uint local_55e4;
  HighsInt local_55e0;
  HighsInt local_55dc;
  HighsOptions *local_55d8;
  vector<HighsIisInfo,std::allocator<HighsIisInfo>> *local_55d0;
  HighsLogOptions *local_55c8;
  HighsLp *local_55c0;
  ulong local_55b8;
  double local_55b0;
  vector<double,_std::allocator<double>_> local_55a8;
  double local_5590;
  HighsLp local_5588;
  Highs local_51f0;
  
  local_55f0 = (options->super_HighsOptionsStruct).iis_strategy;
  local_55d8 = options;
  if (0 < lp->num_col_) {
    HVar19 = 0;
    do {
      addCol(this,HVar19,0);
      HVar19 = HVar19 + 1;
    } while (HVar19 < lp->num_col_);
  }
  if (0 < lp->num_row_) {
    iVar20 = 0;
    do {
      addRow(this,iVar20,0);
      iVar20 = iVar20 + 1;
    } while (iVar20 < lp->num_row_);
  }
  Highs::Highs(&local_51f0);
  local_5650._M_dataplus._M_p = (pointer)&local_5650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5650,"output_flag","");
  Highs::setOptionValue(&local_51f0,&local_5650,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5650._M_dataplus._M_p != &local_5650.field_2) {
    operator_delete(local_5650._M_dataplus._M_p);
  }
  local_5650._M_dataplus._M_p = (pointer)&local_5650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5650,"presolve","");
  Highs::setOptionValue(&local_51f0,&local_5650,&::kHighsOffString_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5650._M_dataplus._M_p != &local_5650.field_2) {
    operator_delete(local_5650._M_dataplus._M_p);
  }
  HighsLp::HighsLp(&local_5588,lp);
  Highs::passModel(&local_51f0,&local_5588);
  HighsLp::~HighsLp(&local_5588);
  if (basis != (HighsBasis *)0x0) {
    local_5650._M_dataplus._M_p = (pointer)&local_5650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5650,"");
    Highs::setBasis(&local_51f0,basis,&local_5650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5650._M_dataplus._M_p != &local_5650.field_2) {
      operator_delete(local_5650._M_dataplus._M_p);
    }
  }
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5650._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_55a8,(long)lp->num_col_,(value_type_conflict1 *)&local_5650);
  pdVar12 = local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  Highs::changeColsCost
            (&local_51f0,0,lp->num_col_ + -1,
             local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  pvVar15 = extraout_RDX;
  if (basis != (HighsBasis *)0x0) {
    local_5650._M_dataplus._M_p = (pointer)&local_5650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5650,"");
    Highs::setBasis(&local_51f0,basis,&local_5650);
    pvVar15 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5650._M_dataplus._M_p != &local_5650.field_2) {
      operator_delete(local_5650._M_dataplus._M_p);
      pvVar15 = extraout_RDX_01;
    }
  }
  HighsTimer::read(&local_51f0.timer_,0,pvVar15,(size_t)pdVar12);
  HVar19 = local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
  local_5628 = extraout_XMM0_Qa;
  HVar8 = Highs::run(&local_51f0);
  if (HVar8 == kOk) {
    HighsTimer::read(&local_51f0.timer_,0,__buf,(size_t)pdVar12);
    local_5650._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_00 - (double)local_5628);
    local_5650._M_string_length._0_4_ =
         local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count - HVar19;
    iVar4._M_current =
         (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::_M_realloc_insert<HighsIisInfo_const&>
                ((vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&this->info_,iVar4,
                 (HighsIisInfo *)&local_5650);
    }
    else {
      (iVar4._M_current)->simplex_time = (double)local_5650._M_dataplus._M_p;
      *(ulong *)&(iVar4._M_current)->simplex_iterations =
           CONCAT44(local_5650._M_string_length._4_4_,(int)local_5650._M_string_length);
      ppHVar1 = &(this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    local_55c8 = &(local_55d8->super_HighsOptionsStruct).log_options;
    local_5628 = &this->row_bound_;
    this_00 = &this->col_bound_;
    local_55d0 = (vector<HighsIisInfo,std::allocator<HighsIisInfo>> *)&this->info_;
    uVar13 = CONCAT71((int7)((ulong)pdVar12 >> 8),1);
    local_55c0 = (HighsLp *)&lp->num_row_;
    uVar17 = 0;
    uVar21 = 0;
    local_5630 = this;
    do {
      local_55e8 = (uint)uVar13;
      local_55ec = uVar21 | local_55f0;
      bVar18 = local_55f0 != 0 & (byte)uVar17 | local_55ec == 0;
      pcVar22 = "Col";
      if (bVar18 != 0) {
        pcVar22 = "Row";
      }
      local_5650._M_dataplus._M_p = (pointer)&local_5650.field_2;
      pcVar14 = "";
      if (bVar18 != 0) {
        pcVar14 = "";
      }
      local_55b8 = uVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5650,pcVar22,pcVar14);
      pHVar10 = lp;
      if (bVar18 != 0) {
        pHVar10 = local_55c0;
      }
      uVar21 = pHVar10->num_col_;
      piVar16 = extraout_RDX_02;
      if (0 < (int)uVar21) {
        local_55e4 = -(uint)bVar18 | 1;
        uVar17 = 0;
        do {
          pvVar11 = this_00;
          if (bVar18 != 0) {
            pvVar11 = local_5628;
          }
          iVar20 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          if ((iVar20 != -1) && (iVar20 != 1)) {
            HVar19 = (HighsInt)uVar17;
            if (bVar18 == 0) {
              pdVar12 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start;
              local_5658 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar17];
              local_5660 = pdVar12[uVar17];
              if (local_5658 != -INFINITY) {
                Highs::changeColBounds(&local_51f0,HVar19,-INFINITY,local_5660);
                pvVar15 = extraout_RDX_04;
                goto LAB_00226fc5;
              }
              if (local_5660 != INFINITY) {
LAB_00227113:
                Highs::changeColBounds(&local_51f0,HVar19,local_5658,INFINITY);
                pvVar15 = extraout_RDX_06;
                goto LAB_00227130;
              }
LAB_002272c0:
              this_01 = (HighsIis *)(uVar17 & 0xffffffff);
              Highs::getCols(&local_51f0,HVar19,HVar19,&local_55dc,&local_5590,(double *)&local_5610
                             ,&local_55b0,&local_55e0,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0)
              ;
            }
            else {
              pdVar12 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start;
              local_5658 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar17];
              local_5660 = pdVar12[uVar17];
              if (local_5658 == -INFINITY) {
LAB_002270cd:
                if (local_5660 != INFINITY) {
                  if (bVar18 == 0) goto LAB_00227113;
                  Highs::changeRowBounds(&local_51f0,HVar19,local_5658,INFINITY);
                  pvVar15 = extraout_RDX_05;
LAB_00227130:
                  HighsTimer::read(&local_51f0.timer_,0,pvVar15,(size_t)pdVar12);
                  HVar7 = local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
                  local_5618 = extraout_XMM0_Qa_03;
                  HVar8 = Highs::run(&local_51f0);
                  piVar16 = __buf_01;
                  if (HVar8 != kOk) goto LAB_0022749c;
                  HighsTimer::read(&local_51f0.timer_,0,__buf_01,(size_t)pdVar12);
                  local_5610._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_04 - local_5618);
                  local_5610._M_string_length._0_4_ =
                       local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count - HVar7;
                  iVar4._M_current =
                       (local_5630->info_).
                       super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (local_5630->info_).
                      super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
                    _M_realloc_insert<HighsIisInfo_const&>
                              (local_55d0,iVar4,(HighsIisInfo *)&local_5610);
                  }
                  else {
                    (iVar4._M_current)->simplex_time = (double)local_5610._M_dataplus._M_p;
                    *(ulong *)&(iVar4._M_current)->simplex_iterations =
                         CONCAT44(local_5610._M_string_length._4_4_,(int)local_5610._M_string_length
                                 );
                    ppHVar1 = &(local_5630->info_).
                               super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppHVar1 = *ppHVar1 + 1;
                  }
                  if (local_51f0.model_status_ == kOptimal) {
                    if (bVar18 == 0) {
                      Highs::changeColBounds(&local_51f0,HVar19,local_5658,local_5660);
                      goto LAB_002272c0;
                    }
                    Highs::changeRowBounds(&local_51f0,HVar19,local_5658,local_5660);
                    goto LAB_00227207;
                  }
                  local_5660 = INFINITY;
                }
                if (bVar18 == 0) goto LAB_002272c0;
              }
              else {
                Highs::changeRowBounds(&local_51f0,HVar19,-INFINITY,local_5660);
                pvVar15 = extraout_RDX_03;
LAB_00226fc5:
                HighsTimer::read(&local_51f0.timer_,0,pvVar15,(size_t)pdVar12);
                HVar7 = local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count;
                local_5618 = extraout_XMM0_Qa_01;
                HVar8 = Highs::run(&local_51f0);
                piVar16 = __buf_00;
                if (HVar8 != kOk) {
LAB_0022749c:
                  iVar20 = 1;
                  local_561c = HVar8;
                  goto LAB_002274a5;
                }
                HighsTimer::read(&local_51f0.timer_,0,__buf_00,(size_t)pdVar12);
                local_5610._M_dataplus._M_p = (pointer)(extraout_XMM0_Qa_02 - local_5618);
                local_5610._M_string_length._0_4_ =
                     local_51f0.info_.super_HighsInfoStruct.simplex_iteration_count - HVar7;
                iVar4._M_current =
                     (local_5630->info_).
                     super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (local_5630->info_).
                    super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<HighsIisInfo,std::allocator<HighsIisInfo>>::
                  _M_realloc_insert<HighsIisInfo_const&>
                            (local_55d0,iVar4,(HighsIisInfo *)&local_5610);
                }
                else {
                  (iVar4._M_current)->simplex_time = (double)local_5610._M_dataplus._M_p;
                  *(ulong *)&(iVar4._M_current)->simplex_iterations =
                       CONCAT44(local_5610._M_string_length._4_4_,(int)local_5610._M_string_length);
                  ppHVar1 = &(local_5630->info_).
                             super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                  *ppHVar1 = *ppHVar1 + 1;
                }
                if (local_51f0.model_status_ != kOptimal) {
                  local_5658 = -INFINITY;
                  goto LAB_002270cd;
                }
                if (bVar18 == 0) {
                  Highs::changeColBounds(&local_51f0,HVar19,local_5658,local_5660);
                  if (local_5660 != INFINITY) {
                    Highs::changeColBounds(&local_51f0,HVar19,local_5658,INFINITY);
                    local_5660 = INFINITY;
                  }
                  goto LAB_002272c0;
                }
                Highs::changeRowBounds(&local_51f0,HVar19,local_5658,local_5660);
                if (local_5660 == INFINITY) goto LAB_002270cd;
                Highs::changeRowBounds(&local_51f0,HVar19,local_5658,INFINITY);
                local_5660 = INFINITY;
              }
LAB_00227207:
              this_01 = (HighsIis *)(uVar17 & 0xffffffff);
              Highs::getRows(&local_51f0,HVar19,HVar19,&local_55dc,(double *)&local_5610,&local_55b0
                             ,&local_55e0,(HighsInt *)0x0,(HighsInt *)0x0,(double *)0x0);
            }
            _Var6._M_p = local_5650._M_dataplus._M_p;
            if (-INFINITY < local_5658) {
              bound_status = (uint)(local_5660 < INFINITY) * 2 + 2;
            }
            else {
              bound_status = local_55e4;
              if (local_5660 < INFINITY) {
                bound_status = 3;
              }
            }
            pvVar11 = this_00;
            if (bVar18 != 0) {
              pvVar11 = local_5628;
            }
            (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar17] = bound_status;
            iisBoundStatusToString_abi_cxx11_(&local_5610,this_01,bound_status);
            highsLogUser(local_55c8,kInfo,"%s %d has status %s\n",_Var6._M_p,uVar17 & 0xffffffff,
                         local_5610._M_dataplus._M_p);
            piVar16 = extraout_RDX_07;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5610._M_dataplus._M_p != &local_5610.field_2) {
              operator_delete(local_5610._M_dataplus._M_p);
              piVar16 = extraout_RDX_08;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar21 != uVar17);
      }
      iVar20 = 0;
      if ((local_55b8 & 1) != 0) {
        iVar20 = 10;
      }
      if (local_55ec == 0 && (local_55b8 & 1) == 0) {
        iVar9 = lp->num_col_;
        iVar20 = 0;
        if (0 < iVar9) {
          uVar17 = 0;
          do {
            piVar16 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar2 = piVar16[uVar17];
            iVar3 = piVar16[uVar17 + 1];
            if (iVar2 < iVar3) {
              piVar16 = (local_5628->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar23 = 0;
              do {
                if (piVar16[(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar2 + lVar23]] != -1)
                goto LAB_0022748b;
                lVar23 = lVar23 + 1;
              } while (iVar3 - iVar2 != (int)lVar23);
            }
            highsLogUser(local_55c8,kInfo,"Col %d has status Dropped: Empty\n",uVar17 & 0xffffffff);
            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar17] = -1;
            Highs::changeColBounds(&local_51f0,(HighsInt)uVar17,-INFINITY,INFINITY);
            iVar9 = lp->num_col_;
            piVar16 = extraout_RDX_09;
LAB_0022748b:
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)iVar9);
        }
      }
LAB_002274a5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5650._M_dataplus._M_p != &local_5650.field_2) {
        operator_delete(local_5650._M_dataplus._M_p);
        piVar16 = extraout_RDX_10;
      }
      if ((iVar20 != 10) && (HVar8 = local_561c, iVar20 != 0)) goto LAB_002275bd;
      uVar21 = 1;
      uVar17 = CONCAT71((int7)((ulong)piVar16 >> 8),1);
      uVar13 = 0;
    } while ((local_55e8 & 1) != 0);
    iVar20 = lp->num_col_;
    uVar17 = 0;
    if (0 < iVar20) {
      piVar16 = (local_5630->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (local_5630->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      do {
        if (piVar5[lVar23] != -1) {
          iVar20 = (int)uVar17;
          piVar16[iVar20] = piVar16[lVar23];
          piVar5[iVar20] = piVar5[lVar23];
          uVar17 = (ulong)(iVar20 + 1);
          iVar20 = lp->num_col_;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < iVar20);
      uVar17 = (ulong)(int)uVar17;
    }
    iVar20 = lp->num_row_;
    __new_size = 0;
    if (0 < iVar20) {
      piVar16 = (local_5630->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (local_5630->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = 0;
      do {
        if (piVar5[lVar23] != -1) {
          iVar20 = (int)__new_size;
          piVar16[iVar20] = piVar16[lVar23];
          piVar5[iVar20] = piVar5[lVar23];
          __new_size = (ulong)(iVar20 + 1);
          iVar20 = lp->num_row_;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < iVar20);
      __new_size = (ulong)(int)__new_size;
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_5630->col_index_,uVar17);
    std::vector<int,_std::allocator<int>_>::resize(this_00,uVar17);
    std::vector<int,_std::allocator<int>_>::resize(&local_5630->row_index_,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(local_5628,__new_size);
    local_5630->valid_ = true;
    local_5630->strategy_ = (local_55d8->super_HighsOptionsStruct).iis_strategy;
    HVar8 = kOk;
  }
LAB_002275bd:
  if (local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_55a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Highs::~Highs(&local_51f0);
  return HVar8;
}

Assistant:

HighsStatus HighsIis::compute(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis* basis) {
  const HighsLogOptions& log_options = options.log_options;
  const bool row_priority =
      //      options.iis_strategy == kIisStrategyFromRayRowPriority ||
      options.iis_strategy == kIisStrategyFromLpRowPriority;
  // Initially all columns and rows are candidates for the IIS
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) this->addCol(iCol);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) this->addRow(iRow);
  Highs highs;
  const HighsInfo& info = highs.getInfo();
  highs.setOptionValue("output_flag", kIisDevReport);
  highs.setOptionValue("presolve", kHighsOffString);
  const HighsLp& incumbent_lp = highs.getLp();
  const HighsBasis& incumbent_basis = highs.getBasis();
  const HighsSolution& solution = highs.getSolution();
  HighsStatus run_status = highs.passModel(lp);
  assert(run_status == HighsStatus::kOk);
  if (basis) highs.setBasis(*basis);

  // Zero the objective
  std::vector<double> cost;
  cost.assign(lp.num_col_, 0);
  run_status = highs.changeColsCost(0, lp.num_col_ - 1, cost.data());
  assert(run_status == HighsStatus::kOk);
  // Solve the LP
  if (basis) highs.setBasis(*basis);
  const bool use_sensitivity_filter = false;
  std::vector<double> primal_phase1_dual;
  bool row_deletion = false;
  HighsInt iX = -1;
  bool drop_lower = false;

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -highs.getRunTime();
    iis_info.simplex_iterations = -info.simplex_iteration_count;
    run_status = highs.run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    HighsModelStatus model_status = highs.getModelStatus();
    if (use_sensitivity_filter &&
        model_status == HighsModelStatus::kInfeasible) {
      printf("\nHighsIis::compute %s deletion for %d and %s bound\n",
             row_deletion ? "Row" : "Col", int(iX),
             drop_lower ? "Lower" : "Upper");
      bool output_flag;
      highs.getOptionValue("output_flag", output_flag);
      highs.setOptionValue("output_flag", true);
      HighsInt simplex_strategy;
      highs.getOptionValue("simplex_strategy", simplex_strategy);
      highs.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      // Solve the LP
      run_status = highs.run();
      if (run_status != HighsStatus::kOk) return run_status;
      highs.writeSolution("", kSolutionStylePretty);
      const HighsInt* basic_index = highs.getBasicVariablesArray();
      std::vector<double> rhs;
      rhs.assign(lp.num_row_, 0);
      // Get duals for nonbasic rows, and initialise duals so that basic duals
      // are zero
      assert(101 == 202);

      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        HighsInt iVar = basic_index[iRow];
        const double lower = iVar < lp.num_col_
                                 ? lp.col_lower_[iVar]
                                 : lp.row_lower_[iVar - lp.num_col_];
        const double upper = iVar < lp.num_col_
                                 ? lp.col_upper_[iVar]
                                 : lp.row_upper_[iVar - lp.num_col_];
        const double value = iVar < lp.num_col_
                                 ? solution.col_value[iVar]
                                 : solution.row_value[iVar - lp.num_col_];
        if (value < lower - options.primal_feasibility_tolerance) {
          rhs[iRow] = -1;
        } else if (value > upper + options.primal_feasibility_tolerance) {
          rhs[iRow] = 1;
        }
      }
      HVector pi;
      pi.setup(lp.num_row_);
      highs.getBasisTransposeSolve(rhs.data(), &pi.array[0], NULL, NULL);
      pi.count = lp.num_row_;
      std::vector<double> reduced_costs_value;
      std::vector<HighsInt> reduced_costs_index;
      lp.a_matrix_.productTransposeQuad(reduced_costs_value,
                                        reduced_costs_index, pi);

      primal_phase1_dual = highs.getPrimalPhase1Dual();
      HighsInt num_zero_dual = 0;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        const HighsBasisStatus status = incumbent_basis.col_status[iCol];
        const double dual = primal_phase1_dual[iCol];
        const double lower = lp.col_lower_[iCol];
        const double upper = lp.col_upper_[iCol];
        const double value = solution.col_value[iCol];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Column %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iCol), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        const HighsBasisStatus status = incumbent_basis.row_status[iRow];
        const double dual = primal_phase1_dual[lp.num_col_ + iRow];
        const double lower = lp.row_lower_[iRow];
        const double upper = lp.row_upper_[iRow];
        const double value = solution.row_value[iRow];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Row    %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iRow), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      highs.setOptionValue("output_flag", output_flag);
      highs.setOptionValue("simplex_strategy", simplex_strategy);
      assert(!num_zero_dual);
    }
    iis_info.simplex_time += highs.getRunTime();
    iis_info.simplex_iterations += info.simplex_iteration_count;
    this->info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();
  if (run_status != HighsStatus::kOk) return run_status;

  assert(highs.getModelStatus() == HighsModelStatus::kInfeasible);

  // Pass twice: rows before columns, or columns before rows, according to
  // row_priority
  for (HighsInt k = 0; k < 2; k++) {
    row_deletion = (row_priority && k == 0) || (!row_priority && k == 1);
    std::string type = row_deletion ? "Row" : "Col";
    // Perform deletion pass
    HighsInt num_index = row_deletion ? lp.num_row_ : lp.num_col_;
    for (iX = 0; iX < num_index; iX++) {
      const HighsInt ix_status =
          row_deletion ? this->row_bound_[iX] : this->col_bound_[iX];
      if (ix_status == kIisBoundStatusDropped ||
          ix_status == kIisBoundStatusFree)
        continue;
      double lower = row_deletion ? lp.row_lower_[iX] : lp.col_lower_[iX];
      double upper = row_deletion ? lp.row_upper_[iX] : lp.col_upper_[iX];
      // Record whether the upper bound has been dropped due to the lower bound
      // being kept
      if (lower > -kHighsInf) {
        // Drop the lower bound temporarily
        bool drop_lower = true;
        run_status = row_deletion
                         ? highs.changeRowBounds(iX, -kHighsInf, upper)
                         : highs.changeColBounds(iX, -kHighsInf, upper);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the lower bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
          // If the lower bound must be kept, then any finite upper bound
          // must be dropped
          const bool apply_reciprocal_rule = true;
          if (apply_reciprocal_rule) {
            if (upper < kHighsInf) {
              // Drop the upper bound permanently
              upper = kHighsInf;
              run_status = row_deletion
                               ? highs.changeRowBounds(iX, lower, upper)
                               : highs.changeColBounds(iX, lower, upper);
              assert(run_status == HighsStatus::kOk);
            }
            assert(upper >= kHighsInf);
            // Since upper = kHighsInf, allow the loop to run so that
            // bound status is set as if upper were set to kHighsInf
            // by relaxing it and finding that the LP was still
            // infeasible
          }
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          lower = -kHighsInf;
        }
      }
      if (upper < kHighsInf) {
        // Drop the upper bound temporarily
        run_status = row_deletion ? highs.changeRowBounds(iX, lower, kHighsInf)
                                  : highs.changeColBounds(iX, lower, kHighsInf);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the upper bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          upper = kHighsInf;
        }
      }
      const bool debug_bound_change = true;
      if (debug_bound_change) {
        // Check bounds have been changed correctly
        double check_lower;
        double check_upper;
        double check_cost;
        HighsInt check_num_ix;
        HighsInt check_num_nz;
        run_status =
            row_deletion
                ? highs.getRows(iX, iX, check_num_ix, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr)
                : highs.getCols(iX, iX, check_num_ix, &check_cost, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr);
        assert(run_status == HighsStatus::kOk);
        assert(check_lower == lower);
        assert(check_upper == upper);
      }
      HighsInt iss_bound_status = kIisBoundStatusNull;
      if (lower <= -kHighsInf) {
        if (upper >= kHighsInf) {
          if (row_deletion) {
            // Free rows can be dropped
            iss_bound_status = kIisBoundStatusDropped;
          } else {
            // Free columns can only be dropped if they are empty
            iss_bound_status = kIisBoundStatusFree;
          }
        } else {
          iss_bound_status = kIisBoundStatusUpper;
        }
      } else {
        if (upper >= kHighsInf) {
          iss_bound_status = kIisBoundStatusLower;
        } else {
          // FX or BX: shouldn't happen
          iss_bound_status = kIisBoundStatusBoxed;
        }
      }
      assert(iss_bound_status != kIisBoundStatusNull);
      assert(iss_bound_status != kIisBoundStatusBoxed);
      if (row_deletion) {
        this->row_bound_[iX] = iss_bound_status;
      } else {
        this->col_bound_[iX] = iss_bound_status;
      }
      highsLogUser(log_options, HighsLogType::kInfo, "%s %d has status %s\n",
                   type.c_str(), int(iX),
                   iisBoundStatusToString(iss_bound_status).c_str());
    }
    if (k == 1) continue;
    // End of first pass: look to simplify second pass
    if (kIisDevReport) this->report("End of deletion", incumbent_lp);
    if (row_deletion) {
      // Mark empty columns as dropped
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        bool empty_col = true;
        for (HighsInt iEl = lp.a_matrix_.start_[iCol];
             iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
          if (this->row_bound_[lp.a_matrix_.index_[iEl]] !=
              kIisBoundStatusDropped) {
            empty_col = false;
            break;
          }
        }
        if (empty_col) {
          highsLogUser(log_options, HighsLogType::kInfo,
                       "Col %d has status Dropped: Empty\n", int(iCol));
          this->col_bound_[iCol] = kIisBoundStatusDropped;
          run_status = highs.changeColBounds(iCol, -kHighsInf, kHighsInf);
          assert(run_status == HighsStatus::kOk);
        }
      }
    }
    if (kIisDevReport) this->report("End of pass 1", incumbent_lp);
  }
  if (kIisDevReport) this->report("End of pass 2", incumbent_lp);
  HighsInt iss_num_col = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (this->col_bound_[iCol] != kIisBoundStatusDropped) {
      this->col_index_[iss_num_col] = this->col_index_[iCol];
      this->col_bound_[iss_num_col] = this->col_bound_[iCol];
      iss_num_col++;
    }
  }
  HighsInt iss_num_row = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (this->row_bound_[iRow] != kIisBoundStatusDropped) {
      this->row_index_[iss_num_row] = this->row_index_[iRow];
      this->row_bound_[iss_num_row] = this->row_bound_[iRow];
      iss_num_row++;
    }
  }
  this->col_index_.resize(iss_num_col);
  this->col_bound_.resize(iss_num_col);
  this->row_index_.resize(iss_num_row);
  this->row_bound_.resize(iss_num_row);
  this->valid_ = true;
  this->strategy_ = options.iis_strategy;
  return HighsStatus::kOk;
}